

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProgramOptions.cpp
# Opt level: O3

void ProgramOptions::getCharsFromFile
               (string *fileName,
               set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *result)

{
  runtime_error *this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  iterator it;
  string str;
  ifstream fs;
  uint32_t local_254;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  char *local_248;
  long local_240;
  char local_238 [16];
  long local_228 [4];
  byte abStack_208 [200];
  undefined8 auStack_140 [36];
  
  std::ifstream::ifstream(local_228,(string *)fileName,_S_bin);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    local_248 = local_238;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_248,
               *(undefined8 *)((long)auStack_140 + *(long *)(local_228[0] + -0x18)),0xffffffff,0,
               0xffffffff);
    local_250._M_current = local_248;
    if (local_240 != 0) {
      end._M_current = local_248 + local_240;
      do {
        local_254 = utf8::next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                              (&local_250,end);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>(&result->_M_t,&local_254);
        end._M_current = local_248 + local_240;
      } while (local_250._M_current != end._M_current);
    }
    if (local_248 != local_238) {
      operator_delete(local_248);
    }
    std::ifstream::~ifstream(local_228);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"can\'t open characters file");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ProgramOptions::getCharsFromFile(const std::string& fileName, std::set<std::uint32_t>& result)
{
    std::ifstream fs(fileName, std::ifstream::binary);
    if (!fs)
        throw std::runtime_error("can't open characters file");
    std::string str((std::istreambuf_iterator<char>(fs)),
                    std::istreambuf_iterator<char>());

    for (auto it = str.begin(); it != str.end();)
        result.insert(utf8::next(it, str.end()));
}